

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::Base64UnescapeInternal
              (char *src_param,int szsrc,char *dest,int szdest,char *unbase64)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  byte *pbVar14;
  uint uVar15;
  ulong local_48;
  
  if (dest == (char *)0x0) {
    uVar6 = 0;
    local_48 = 0;
    uVar8 = 0;
    uVar5 = 0;
    pbVar14 = (byte *)src_param;
LAB_002d140e:
    uVar15 = (uint)uVar8;
    if (3 < szsrc) {
      if (((((ulong)(byte)*src_param == 0) || ((ulong)((byte *)src_param)[1] == 0)) ||
          ((ulong)((byte *)src_param)[2] == 0)) ||
         (uVar5 = (int)unbase64[((byte *)src_param)[3]] |
                  (int)unbase64[((byte *)src_param)[2]] << 6 |
                  (int)unbase64[((byte *)src_param)[1]] << 0xc |
                  (int)unbase64[(byte)*src_param] << 0x12, (int)uVar5 < 0)) {
        pbVar3 = (byte *)src_param + 2;
        pbVar2 = (byte *)src_param + 3;
        pbVar14 = (byte *)(ulong)(szsrc - 2);
        pbVar10 = (byte *)src_param + 4;
        uVar13 = szsrc + 1;
        pbVar12 = (byte *)src_param;
        iVar4 = szsrc;
LAB_002d1494:
        uVar11 = uVar13;
        szsrc = szsrc + -1;
        src_param = (char *)(pbVar12 + 1);
        bVar1 = *pbVar12;
        uVar15 = (uint)bVar1;
        uVar6 = (uint)unbase64[bVar1];
        if (unbase64[bVar1] < '\0') {
          if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
          goto code_r0x002d14c0;
          goto LAB_002d15db;
        }
        goto LAB_002d1518;
      }
      szsrc = szsrc + -4;
      src_param = (char *)((byte *)src_param + 4);
      uVar8 = 0;
      uVar6 = 0xffffffff;
      goto LAB_002d15b5;
    }
    uVar11 = 0;
    uVar13 = uVar5;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    local_48 = 0;
    pbVar3 = (byte *)src_param;
    uVar13 = 0;
LAB_002d120a:
    uVar15 = (uint)uVar8;
    if (3 < szsrc) {
      if (((((ulong)*pbVar3 == 0) || ((ulong)pbVar3[1] == 0)) || ((ulong)pbVar3[2] == 0)) ||
         (uVar13 = (int)unbase64[pbVar3[3]] |
                   (int)unbase64[pbVar3[2]] << 6 |
                   (int)unbase64[pbVar3[1]] << 0xc | (int)unbase64[*pbVar3] << 0x12, (int)uVar13 < 0
         )) {
        pbVar2 = pbVar3 + 2;
        pbVar12 = pbVar3 + 3;
        iVar9 = szsrc + -2;
        pbVar14 = pbVar3 + 4;
        uVar6 = szsrc + 1;
        iVar4 = szsrc;
LAB_002d1297:
        uVar11 = uVar6;
        szsrc = szsrc + -1;
        src_param = (char *)(pbVar3 + 1);
        bVar1 = *pbVar3;
        uVar15 = (uint)bVar1;
        uVar5 = (uint)unbase64[bVar1];
        if (unbase64[bVar1] < '\0') {
          if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
          goto code_r0x002d12c2;
          goto LAB_002d15be;
        }
        goto LAB_002d131c;
      }
      szsrc = szsrc + -4;
      uVar8 = 0;
      uVar6 = 0xffffffff;
      pbVar3 = pbVar3 + 4;
      goto LAB_002d13cd;
    }
    uVar11 = 0;
    pbVar14 = (byte *)src_param;
    src_param = (char *)pbVar3;
  }
LAB_002d15f1:
  if ((int)uVar6 < 0) {
    if ((uVar15 == 0x3d) || (uVar15 == 0x2e)) goto LAB_002d16d5;
    if (uVar15 == 0) goto LAB_002d1647;
    if (0x20 < (byte)uVar15) {
      return -1;
    }
    if ((0x100003e00U >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
      return -1;
    }
  }
  if ((uVar15 != 0x3d) && (uVar15 != 0x2e)) {
LAB_002d1647:
    while( true ) {
      while( true ) {
        iVar4 = szsrc;
        pbVar14 = (byte *)src_param;
        if (iVar4 < 1) {
          iVar4 = (*(code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]))
                            (&DAT_00398ffc,
                             (code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]));
          return iVar4;
        }
        bVar1 = *pbVar14;
        if (unbase64[bVar1] < '\0') break;
        uVar6 = uVar13 << 6;
        uVar5 = (int)unbase64[bVar1] | uVar6;
        uVar11 = uVar11 + 1;
        src_param = (char *)(pbVar14 + 1);
        szsrc = iVar4 + -1;
        uVar13 = uVar5;
        if (uVar11 == 4) {
          iVar7 = (int)local_48;
          local_48 = (ulong)(iVar7 + 3U);
          uVar11 = 0;
          uVar13 = 0;
          src_param = (char *)(pbVar14 + 1);
          szsrc = iVar4 + -1;
          if (dest != (char *)0x0) {
            if (szdest < (int)(iVar7 + 3U)) {
              return -1;
            }
            dest[(long)iVar7 + 2] = (char)uVar5;
            dest[(long)iVar7 + 1] = (char)(uVar6 >> 8);
            dest[iVar7] = (char)(uVar6 >> 0x10);
          }
        }
      }
      if (0x3d < bVar1) {
        return -1;
      }
      uVar8 = (ulong)(uint)bVar1;
      if ((0x100003e00U >> (uVar8 & 0x3f) & 1) == 0) break;
      src_param = (char *)(pbVar14 + 1);
      szsrc = iVar4 + -1;
    }
    if ((0x2000400000000000U >> (uVar8 & 0x3f) & 1) != 0) {
      iVar4 = (*(code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]))
                        (&DAT_00398ffc,
                         (code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]));
      return iVar4;
    }
    if (uVar8 != 0) {
      return -1;
    }
    iVar4 = (*(code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]))
                      (&DAT_00398ffc,
                       (code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]));
    return iVar4;
  }
LAB_002d16d5:
  iVar4 = (*(code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]))
                    (pbVar14,&DAT_00398ffc,
                     (code *)((long)&DAT_00398ffc + (long)(int)(&DAT_00398ffc)[uVar11]),
                     0x2000400000000000,unbase64,local_48 & 0xffffffff);
  return iVar4;
code_r0x002d14c0:
  uVar13 = uVar11 - 1;
  iVar4 = iVar4 + -1;
  pbVar3 = pbVar3 + 1;
  pbVar2 = pbVar2 + 1;
  pbVar14 = (byte *)(ulong)((int)pbVar14 - 1);
  pbVar10 = pbVar10 + 1;
  pbVar12 = (byte *)src_param;
  if (uVar13 < 5) {
LAB_002d15db:
    szsrc = uVar11 - 2;
    uVar11 = 0;
    uVar13 = uVar5;
    goto LAB_002d15f1;
  }
  goto LAB_002d1494;
LAB_002d1518:
  iVar7 = iVar4;
  src_param = (char *)pbVar3;
  uVar15 = (uint)((byte *)src_param)[-1];
  uVar6 = (uint)unbase64[uVar15];
  if (-1 < unbase64[uVar15]) goto LAB_002d155a;
  if ((0x20 < uVar15) || ((0x100003e00U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) goto LAB_002d15cf;
  szsrc = szsrc + -1;
  pbVar2 = pbVar2 + 1;
  pbVar14 = (byte *)(ulong)((int)pbVar14 - 1);
  pbVar10 = pbVar10 + 1;
  pbVar3 = (byte *)src_param + 1;
  iVar4 = iVar7 + -1;
  if (iVar7 + -1 < 4) goto LAB_002d15cf;
  goto LAB_002d1518;
LAB_002d155a:
  iVar4 = szsrc;
  src_param = (char *)pbVar2;
  uVar15 = (uint)((byte *)src_param)[-1];
  uVar6 = (uint)unbase64[uVar15];
  if (-1 < unbase64[uVar15]) goto LAB_002d156e;
  if ((0x20 < uVar15) || ((0x100003e00U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) goto LAB_002d15e4;
  pbVar14 = (byte *)(ulong)((int)pbVar14 - 1);
  pbVar10 = pbVar10 + 1;
  pbVar2 = (byte *)src_param + 1;
  szsrc = iVar4 + -1;
  if (iVar4 + -1 < 3) goto LAB_002d15e4;
  goto LAB_002d155a;
LAB_002d156e:
  src_param = (char *)pbVar10;
  iVar4 = (int)pbVar14;
  bVar1 = ((byte *)src_param)[-1];
  uVar8 = (ulong)bVar1;
  uVar15 = (uint)bVar1;
  uVar6 = (uint)unbase64[uVar8];
  if (-1 < unbase64[uVar8]) goto LAB_002d15aa;
  if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) goto LAB_002d1758;
  pbVar14 = (byte *)(ulong)(iVar4 - 1U);
  pbVar10 = (byte *)src_param + 1;
  if ((int)(iVar4 - 1U) < 2) goto LAB_002d1758;
  goto LAB_002d156e;
LAB_002d15aa:
  szsrc = iVar4 + -2;
LAB_002d15b5:
  local_48 = (ulong)((int)local_48 + 3);
  goto LAB_002d140e;
code_r0x002d12c2:
  uVar6 = uVar11 - 1;
  iVar4 = iVar4 + -1;
  pbVar2 = pbVar2 + 1;
  pbVar12 = pbVar12 + 1;
  iVar9 = iVar9 + -1;
  pbVar14 = pbVar14 + 1;
  pbVar3 = (byte *)src_param;
  if (uVar6 < 5) {
LAB_002d15be:
    szsrc = uVar11 - 2;
    uVar11 = 0;
    uVar6 = uVar5;
    goto LAB_002d15f1;
  }
  goto LAB_002d1297;
LAB_002d131c:
  iVar7 = iVar4;
  src_param = (char *)pbVar2;
  uVar15 = (uint)((byte *)src_param)[-1];
  uVar6 = (uint)unbase64[uVar15];
  if (-1 < unbase64[uVar15]) goto code_r0x002d132b;
  if ((0x20 < uVar15) || ((0x100003e00U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) goto LAB_002d15cf;
  szsrc = szsrc + -1;
  pbVar12 = pbVar12 + 1;
  iVar9 = iVar9 + -1;
  pbVar14 = pbVar14 + 1;
  pbVar2 = (byte *)src_param + 1;
  iVar4 = iVar7 + -1;
  if (iVar7 + -1 < 4) goto LAB_002d15cf;
  goto LAB_002d131c;
code_r0x002d132b:
  uVar5 = uVar5 << 6 | uVar6;
  while( true ) {
    iVar4 = szsrc;
    src_param = (char *)pbVar12;
    bVar1 = ((byte *)src_param)[-1];
    uVar15 = (uint)bVar1;
    uVar6 = (uint)unbase64[bVar1];
    if (-1 < unbase64[bVar1]) break;
    if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
    goto LAB_002d15e4;
    iVar9 = iVar9 + -1;
    pbVar14 = pbVar14 + 1;
    pbVar12 = (byte *)src_param + 1;
    szsrc = iVar4 + -1;
    if (iVar4 + -1 < 3) goto LAB_002d15e4;
  }
  uVar5 = uVar5 << 6 | uVar6;
  while( true ) {
    iVar4 = iVar9;
    src_param = (char *)pbVar14;
    bVar1 = ((byte *)src_param)[-1];
    uVar8 = (ulong)bVar1;
    uVar15 = (uint)bVar1;
    uVar6 = (uint)unbase64[uVar8];
    if (-1 < unbase64[uVar8]) break;
    pbVar14 = (byte *)src_param;
    if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
    goto LAB_002d1758;
    pbVar14 = (byte *)src_param + 1;
    iVar9 = iVar4 + -1;
    if (iVar4 + -1 < 2) goto LAB_002d1758;
  }
  uVar13 = uVar5 << 6 | uVar6;
  szsrc = iVar4 + -2;
  pbVar3 = (byte *)src_param;
LAB_002d13cd:
  if (szdest < (int)(local_48 + 3)) {
    return -1;
  }
  *(ushort *)(dest + local_48 + 1) = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
  dest[local_48] = (char)(uVar13 >> 0x10);
  local_48 = local_48 + 3;
  uVar13 = uVar13 >> 0x10;
  goto LAB_002d120a;
LAB_002d1758:
  szsrc = iVar4 + -2;
  uVar11 = 3;
  uVar13 = uVar5;
  goto LAB_002d15f1;
LAB_002d15e4:
  szsrc = iVar4 + -2;
  uVar11 = 2;
  uVar13 = uVar5;
  goto LAB_002d15f1;
LAB_002d15cf:
  szsrc = iVar7 + -2;
  uVar11 = 1;
  uVar13 = uVar5;
  goto LAB_002d15f1;
}

Assistant:

int Base64UnescapeInternal(const char *src_param, int szsrc,
                           char *dest, int szdest,
                           const signed char* unbase64) {
  static const char kPad64Equals = '=';
  static const char kPad64Dot = '.';

  int decode = 0;
  int destidx = 0;
  int state = 0;
  unsigned int ch = 0;
  unsigned int temp = 0;

  // If "char" is signed by default, using *src as an array index results in
  // accessing negative array elements. Treat the input as a pointer to
  // unsigned char to avoid this.
  const unsigned char *src = reinterpret_cast<const unsigned char*>(src_param);

  // The GET_INPUT macro gets the next input character, skipping
  // over any whitespace, and stopping when we reach the end of the
  // string or when we read any non-data character.  The arguments are
  // an arbitrary identifier (used as a label for goto) and the number
  // of data bytes that must remain in the input to avoid aborting the
  // loop.
#define GET_INPUT(label, remain)                 \
  label:                                         \
    --szsrc;                                     \
    ch = *src++;                                 \
    decode = unbase64[ch];                       \
    if (decode < 0) {                            \
      if (ascii_isspace(ch) && szsrc >= remain)  \
        goto label;                              \
      state = 4 - remain;                        \
      break;                                     \
    }

  // if dest is null, we're just checking to see if it's legal input
  // rather than producing output.  (I suspect this could just be done
  // with a regexp...).  We duplicate the loop so this test can be
  // outside it instead of in every iteration.

  if (dest) {
    // This loop consumes 4 input bytes and produces 3 output bytes
    // per iteration.  We can't know at the start that there is enough
    // data left in the string for a full iteration, so the loop may
    // break out in the middle; if so 'state' will be set to the
    // number of input bytes read.

    while (szsrc >= 4)  {
      // We'll start by optimistically assuming that the next four
      // bytes of the string (src[0..3]) are four good data bytes
      // (that is, no nulls, whitespace, padding chars, or illegal
      // chars).  We need to test src[0..2] for nulls individually
      // before constructing temp to preserve the property that we
      // never read past a null in the string (no matter how long
      // szsrc claims the string is).

      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        // Iff any of those four characters was bad (null, illegal,
        // whitespace, padding), then temp's high bit will be set
        // (because unbase64[] is -1 for all bad characters).
        //
        // We'll back up and resort to the slower decoder, which knows
        // how to handle those cases.

        GET_INPUT(first, 4);
        temp = decode;
        GET_INPUT(second, 3);
        temp = (temp << 6) | decode;
        GET_INPUT(third, 2);
        temp = (temp << 6) | decode;
        GET_INPUT(fourth, 1);
        temp = (temp << 6) | decode;
      } else {
        // We really did have four good data bytes, so advance four
        // characters in the string.

        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }

      // temp has 24 bits of input, so write that out as three bytes.

      if (destidx+3 > szdest) return -1;
      dest[destidx+2] = temp;
      temp >>= 8;
      dest[destidx+1] = temp;
      temp >>= 8;
      dest[destidx] = temp;
      destidx += 3;
    }
  } else {
    while (szsrc >= 4)  {
      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        GET_INPUT(first_no_dest, 4);
        GET_INPUT(second_no_dest, 3);
        GET_INPUT(third_no_dest, 2);
        GET_INPUT(fourth_no_dest, 1);
      } else {
        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }
      destidx += 3;
    }
  }

#undef GET_INPUT

  // if the loop terminated because we read a bad character, return
  // now.
  if (decode < 0 && ch != '\0' &&
      ch != kPad64Equals && ch != kPad64Dot && !ascii_isspace(ch))
    return -1;

  if (ch == kPad64Equals || ch == kPad64Dot) {
    // if we stopped by hitting an '=' or '.', un-read that character -- we'll
    // look at it again when we count to check for the proper number of
    // equals signs at the end.
    ++szsrc;
    --src;
  } else {
    // This loop consumes 1 input byte per iteration.  It's used to
    // clean up the 0-3 input bytes remaining when the first, faster
    // loop finishes.  'temp' contains the data from 'state' input
    // characters read by the first loop.
    while (szsrc > 0)  {
      --szsrc;
      ch = *src++;
      decode = unbase64[ch];
      if (decode < 0) {
        if (ascii_isspace(ch)) {
          continue;
        } else if (ch == '\0') {
          break;
        } else if (ch == kPad64Equals || ch == kPad64Dot) {
          // back up one character; we'll read it again when we check
          // for the correct number of pad characters at the end.
          ++szsrc;
          --src;
          break;
        } else {
          return -1;
        }
      }

      // Each input character gives us six bits of output.
      temp = (temp << 6) | decode;
      ++state;
      if (state == 4) {
        // If we've accumulated 24 bits of output, write that out as
        // three bytes.
        if (dest) {
          if (destidx+3 > szdest) return -1;
          dest[destidx+2] = temp;
          temp >>= 8;
          dest[destidx+1] = temp;
          temp >>= 8;
          dest[destidx] = temp;
        }
        destidx += 3;
        state = 0;
        temp = 0;
      }
    }
  }

  // Process the leftover data contained in 'temp' at the end of the input.
  int expected_equals = 0;
  switch (state) {
    case 0:
      // Nothing left over; output is a multiple of 3 bytes.
      break;

    case 1:
      // Bad input; we have 6 bits left over.
      return -1;

    case 2:
      // Produce one more output byte from the 12 input bits we have left.
      if (dest) {
        if (destidx+1 > szdest) return -1;
        temp >>= 4;
        dest[destidx] = temp;
      }
      ++destidx;
      expected_equals = 2;
      break;

    case 3:
      // Produce two more output bytes from the 18 input bits we have left.
      if (dest) {
        if (destidx+2 > szdest) return -1;
        temp >>= 2;
        dest[destidx+1] = temp;
        temp >>= 8;
        dest[destidx] = temp;
      }
      destidx += 2;
      expected_equals = 1;
      break;

    default:
      // state should have no other values at this point.
      GOOGLE_LOG(FATAL) << "This can't happen; base64 decoder state = " << state;
  }

  // The remainder of the string should be all whitespace, mixed with
  // exactly 0 equals signs, or exactly 'expected_equals' equals
  // signs.  (Always accepting 0 equals signs is a google extension
  // not covered in the RFC, as is accepting dot as the pad character.)

  int equals = 0;
  while (szsrc > 0 && *src) {
    if (*src == kPad64Equals || *src == kPad64Dot)
      ++equals;
    else if (!ascii_isspace(*src))
      return -1;
    --szsrc;
    ++src;
  }

  return (equals == 0 || equals == expected_equals) ? destidx : -1;
}